

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultReporterFactory.cpp
# Opt level: O1

shared_ptr<ApprovalTests::Reporter> * ApprovalTests::DefaultReporterFactory::defaultReporter(void)

{
  int iVar1;
  undefined1 local_19;
  DiffReporter *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  if (defaultReporter()::reporter == '\0') {
    iVar1 = __cxa_guard_acquire(&defaultReporter()::reporter);
    if (iVar1 != 0) {
      local_18 = (DiffReporter *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<ApprovalTests::DiffReporter,std::allocator<ApprovalTests::DiffReporter>>
                (&_Stack_10,&local_18,(allocator<ApprovalTests::DiffReporter> *)&local_19);
      defaultReporter::reporter.
      super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_10._M_pi;
      defaultReporter::reporter.
      super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_18;
      __cxa_atexit(::std::__shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&defaultReporter::reporter,&__dso_handle);
      __cxa_guard_release(&defaultReporter()::reporter);
    }
  }
  return &defaultReporter::reporter;
}

Assistant:

std::shared_ptr<Reporter>& DefaultReporterFactory::defaultReporter()
    {
        static std::shared_ptr<Reporter> reporter = std::make_shared<DiffReporter>();
        return reporter;
    }